

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQChar * sq_getlocal(HSQUIRRELVM v,SQUnsignedInteger level,SQUnsignedInteger idx)

{
  SQVM *vm;
  SQVM *stackbase_00;
  SQUnsignedInteger nseq;
  long lVar1;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  SQFunctionProto *func;
  SQClosure *c;
  CallInfo *ci;
  CallInfo *ci_1;
  SQUnsignedInteger i;
  SQInteger stackbase;
  SQUnsignedInteger lvl;
  SQUnsignedInteger cstksize;
  SQObjectPtr *in_stack_ffffffffffffff98;
  SQVM *this;
  ulong nop;
  SQChar *local_8;
  
  vm = *(SQVM **)(in_RDI + 200);
  stackbase_00 = (SQVM *)((long)vm + (-1 - in_RSI));
  nseq = *(SQUnsignedInteger *)(in_RDI + 0x50);
  if (stackbase_00 < vm) {
    for (nop = 0; nop < in_RSI; nop = nop + 1) {
      nseq = nseq - (long)*(int *)(*(long *)(in_RDI + 0xc0) + ((long)vm + (-1 - nop)) * 0x48 + 0x2c)
      ;
    }
    lVar1 = *(long *)(in_RDI + 0xc0) + (long)stackbase_00 * 0x48;
    if (*(int *)(lVar1 + 0x10) == 0x8000100) {
      this = *(SQVM **)(*(long *)(lVar1 + 0x18) + 0x48);
      if (in_RDX < (this->temp_reg).super_SQObject._unVal.nInteger) {
        SQVM::Push(this,in_stack_ffffffffffffff98);
        local_8 = (SQChar *)(*(long *)((long)&this->_callsstack->_closure + in_RDX * 0x28) + 0x38);
      }
      else {
        local_8 = SQFunctionProto::GetLocal
                            ((SQFunctionProto *)
                             (in_RDX - (this->temp_reg).super_SQObject._unVal.nInteger),vm,
                             (SQUnsignedInteger)stackbase_00,nseq,nop);
      }
    }
    else {
      local_8 = (SQChar *)0x0;
    }
  }
  else {
    local_8 = (SQChar *)0x0;
  }
  return local_8;
}

Assistant:

const SQChar *sq_getlocal(HSQUIRRELVM v,SQUnsignedInteger level,SQUnsignedInteger idx)
{
    SQUnsignedInteger cstksize=v->_callsstacksize;
    SQUnsignedInteger lvl=(cstksize-level)-1;
    SQInteger stackbase=v->_stackbase;
    if(lvl<cstksize){
        for(SQUnsignedInteger i=0;i<level;i++){
            SQVM::CallInfo &ci=v->_callsstack[(cstksize-i)-1];
            stackbase-=ci._prevstkbase;
        }
        SQVM::CallInfo &ci=v->_callsstack[lvl];
        if(type(ci._closure)!=OT_CLOSURE)
            return NULL;
        SQClosure *c=_closure(ci._closure);
        SQFunctionProto *func=c->_function;
        if(func->_noutervalues > (SQInteger)idx) {
            v->Push(*_outer(c->_outervalues[idx])->_valptr);
            return _stringval(func->_outervalues[idx]._name);
        }
        idx -= func->_noutervalues;
        return func->GetLocal(v,stackbase,idx,(SQInteger)(ci._ip-func->_instructions)-1);
    }
    return NULL;
}